

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_RenderContent * __thiscall
ON_RenderContentPrivate::FindChild(ON_RenderContentPrivate *this,wchar_t *child_slot_name)

{
  bool bVar1;
  ON_wString local_38;
  ON_RenderContent *local_30;
  ON_RenderContent *child_rc;
  lock_guard<std::recursive_mutex> lg;
  wchar_t *child_slot_name_local;
  ON_RenderContentPrivate *this_local;
  
  lg._M_device = (mutex_type *)child_slot_name;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&child_rc,&this->m_mutex);
  local_30 = this->m_first_child;
  do {
    if (local_30 == (ON_RenderContent *)0x0) {
      this_local = (ON_RenderContentPrivate *)0x0;
LAB_008192cd:
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)&child_rc);
      return (ON_RenderContent *)this_local;
    }
    (*(local_30->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x3b])(&local_38);
    bVar1 = ::operator==(&local_38,(wchar_t *)lg._M_device);
    ON_wString::~ON_wString(&local_38);
    if (bVar1) {
      this_local = (ON_RenderContentPrivate *)local_30;
      goto LAB_008192cd;
    }
    local_30 = local_30->_private->m_next_sibling;
  } while( true );
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindChild(const wchar_t* child_slot_name) const
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  ON_RenderContent* child_rc = m_first_child;
  while (nullptr != child_rc)
  {
    if (child_rc->ChildSlotName() == child_slot_name)
      return child_rc;

    child_rc = child_rc->_private->m_next_sibling;
  }

  return nullptr;
}